

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

SegmentBuilder * __thiscall
capnp::_::BuilderArena::addSegmentInternal<capnp::word>
          (BuilderArena *this,ArrayPtr<capnp::word> content)

{
  bool bVar1;
  size_t sVar2;
  MultiSegmentState *this_00;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *t;
  SegmentBuilder *pSVar3;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *params;
  SegmentBuilder *result;
  word *local_d8;
  Id<unsigned_int,_capnp::_::Segment> local_cc;
  BuilderArena *local_c8;
  undefined1 local_c0 [8];
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> newBuilder;
  undefined1 local_a0 [8];
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> newSegmentState;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *s;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *_s279;
  MultiSegmentState *segmentState;
  SegmentWordCount contentSize;
  Fault local_68;
  Fault f;
  BuilderArena *local_58;
  BuilderArena *local_50;
  undefined1 local_48 [8];
  DebugComparison<capnp::_::BuilderArena_*,_std::nullptr_t> _kjCondition;
  BuilderArena *this_local;
  ArrayPtr<capnp::word> content_local;
  
  content_local.ptr = (word *)content.size_;
  this_local = (BuilderArena *)content.ptr;
  _kjCondition._32_8_ = this;
  local_58 = SegmentBuilder::getArena(&this->segment0);
  local_50 = (BuilderArena *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<capnp::_::BuilderArena*>::operator!=
            ((DebugComparison<capnp::_::BuilderArena_*,_std::nullptr_t> *)local_48,
             (DebugExpression<capnp::_::BuilderArena*> *)&local_50,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::BuilderArena*,decltype(nullptr)>&,char_const(&)[69]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
               ,0x112,FAILED,"segment0.getArena() != nullptr",
               "_kjCondition,\"Can\'t allocate external segments before allocating the root segment.\""
               ,(DebugComparison<capnp::_::BuilderArena_*,_std::nullptr_t> *)local_48,
               (char (*) [69])
               "Can\'t allocate external segments before allocating the root segment.");
    kj::_::Debug::Fault::fatal(&local_68);
  }
  sVar2 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)&this_local);
  segmentState._0_4_ = verifySegmentSize(sVar2);
  this_00 = (MultiSegmentState *)
            kj::_::readMaybe<capnp::_::BuilderArena::MultiSegmentState,decltype(nullptr)>
                      (&this->moreSegments);
  if (this_00 == (MultiSegmentState *)0x0) {
    kj::heap<capnp::_::BuilderArena::MultiSegmentState>();
    _s279 = (Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)
            kj::Own::operator_cast_to_MultiSegmentState_((Own *)local_a0);
    t = kj::mv<kj::Own<capnp::_::BuilderArena::MultiSegmentState,decltype(nullptr)>>
                  ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)local_a0);
    kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>_> *)
               &newBuilder.ptr,t);
    kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>_>::operator=
              (&this->moreSegments,
               (Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>_> *)
               &newBuilder.ptr);
    kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>_>::~Maybe
              ((Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>_> *)
               &newBuilder.ptr);
    kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::~Own
              ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)local_a0);
  }
  else {
    newSegmentState.ptr = this_00;
    _s279 = (Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)
            kj::Own::operator_cast_to_MultiSegmentState_((Own *)this_00);
  }
  local_c8 = this;
  sVar2 = kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::size
                    ((Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> *)_s279);
  kj::Id<unsigned_int,_capnp::_::Segment>::Id(&local_cc,(int)sVar2 + 1);
  local_d8 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)&this_local);
  result = (SegmentBuilder *)&this->dummyLimiter;
  kj::
  heap<capnp::_::SegmentBuilder,capnp::_::BuilderArena*,kj::Id<unsigned_int,capnp::_::Segment>,capnp::word*,unsigned_int&,capnp::_::ReadLimiter*>
            ((kj *)local_c0,&local_c8,&local_cc,&local_d8,(uint *)&segmentState,
             (ReadLimiter **)&result);
  pSVar3 = kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>::get
                     ((Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)local_c0);
  params = kj::mv<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>>
                     ((Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)local_c0);
  kj::Vector<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>>::
  add<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>>
            ((Vector<kj::Own<capnp::_::SegmentBuilder,decltype(nullptr)>> *)_s279,params);
  sVar2 = kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::size
                    ((Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> *)_s279);
  kj::Vector<kj::ArrayPtr<const_capnp::word>_>::resize
            ((Vector<kj::ArrayPtr<const_capnp::word>_> *)(_s279 + 2),sVar2 + 1);
  kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>::~Own
            ((Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)local_c0);
  return pSVar3;
}

Assistant:

SegmentBuilder* BuilderArena::addSegmentInternal(kj::ArrayPtr<T> content) {
  // This check should never fail in practice, since you can't get an Orphanage without allocating
  // the root segment.
  KJ_REQUIRE(segment0.getArena() != nullptr,
      "Can't allocate external segments before allocating the root segment.");

  auto contentSize = verifySegmentSize(content.size());

  MultiSegmentState* segmentState;
  KJ_IF_SOME(s, moreSegments) {
    segmentState = s;
  } else {
    auto newSegmentState = kj::heap<MultiSegmentState>();
    segmentState = newSegmentState;
    moreSegments = kj::mv(newSegmentState);
  }